

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<VkSpecParser::Command>::erase
          (QGenericArrayOps<VkSpecParser::Command> *this,Command *b,qsizetype n)

{
  Command *pCVar1;
  long lVar2;
  Command *__last;
  Command *pCVar3;
  
  __last = b + n;
  pCVar1 = (this->super_QArrayDataPointer<VkSpecParser::Command>).ptr;
  lVar2 = (this->super_QArrayDataPointer<VkSpecParser::Command>).size;
  pCVar3 = pCVar1 + lVar2;
  if (__last == pCVar3 || pCVar1 != b) {
    for (; __last = b + n, __last != pCVar3; b = b + 1) {
      VkSpecParser::Command::operator=(b,__last);
    }
    lVar2 = (this->super_QArrayDataPointer<VkSpecParser::Command>).size;
  }
  else {
    (this->super_QArrayDataPointer<VkSpecParser::Command>).ptr = __last;
  }
  (this->super_QArrayDataPointer<VkSpecParser::Command>).size = lVar2 - n;
  std::_Destroy_aux<false>::__destroy<VkSpecParser::Command*>(b,__last);
  return;
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;
        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else {
            const T *const end = this->end();

            // move (by assignment) the elements from e to end
            // onto b to the new end
            while (e != end) {
                *b = std::move(*e);
                ++b;
                ++e;
            }
        }
        this->size -= n;
        std::destroy(b, e);
    }